

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

size_t HTTPResponseCallback(void *ptr,size_t size,size_t nmemb,void *data)

{
  char *chPtr;
  string *response;
  int realsize;
  void *data_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  std::__cxx11::string::operator+=((string *)data,(char *)ptr);
  return (long)((int)size * (int)nmemb);
}

Assistant:

static size_t
HTTPResponseCallback(void *ptr, size_t size, size_t nmemb, void *data)
{
  int realsize = (int)(size * nmemb);

  std::string *response
    = static_cast<std::string*>(data);
  const char* chPtr = static_cast<char*>(ptr);
  *response += chPtr;

  return realsize;
}